

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_task_manager.hpp
# Opt level: O0

void __thiscall
duckdb::BatchTaskManager<duckdb::BatchCopyTask>::AddTask
          (BatchTaskManager<duckdb::BatchCopyTask> *this,
          unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true> *task)

{
  queue<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::deque<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>_>
  *in_RSI;
  mutex_type *in_RDI;
  lock_guard<std::mutex> l;
  
  ::std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RSI,in_RDI);
  ::std::
  queue<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::deque<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>_>
  ::push(in_RSI,(value_type *)in_RDI);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x187a5d4);
  return;
}

Assistant:

void AddTask(unique_ptr<TASK> task) {
		lock_guard<mutex> l(task_lock);
		task_queue.push(std::move(task));
	}